

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.c
# Opt level: O1

int yaml_parser_initialize(yaml_parser_t *parser)

{
  uchar *puVar1;
  yaml_char_t *pyVar2;
  yaml_token_t *pyVar3;
  int *piVar4;
  yaml_simple_key_t *pyVar5;
  yaml_parser_state_t *pyVar6;
  yaml_mark_t *pyVar7;
  yaml_tag_directive_t *pyVar8;
  
  if (parser == (yaml_parser_t *)0x0) {
    __assert_fail("parser",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/api.c"
                  ,0xb3,"int yaml_parser_initialize(yaml_parser_t *)");
  }
  memset(parser,0,0x1e0);
  puVar1 = (uchar *)malloc(0x4000);
  (parser->raw_buffer).start = puVar1;
  if (puVar1 != (uchar *)0x0) {
    (parser->raw_buffer).pointer = puVar1;
    (parser->raw_buffer).last = puVar1;
    (parser->raw_buffer).end = puVar1 + 0x4000;
    pyVar2 = (yaml_char_t *)malloc(0xc000);
    (parser->buffer).start = pyVar2;
    if (pyVar2 != (yaml_char_t *)0x0) {
      (parser->buffer).pointer = pyVar2;
      (parser->buffer).last = pyVar2;
      (parser->buffer).end = pyVar2 + 0xc000;
      pyVar3 = (yaml_token_t *)malloc(0x500);
      (parser->tokens).start = pyVar3;
      if (pyVar3 != (yaml_token_t *)0x0) {
        (parser->tokens).tail = pyVar3;
        (parser->tokens).head = pyVar3;
        (parser->tokens).end = pyVar3 + 0x10;
        piVar4 = (int *)malloc(0x40);
        (parser->indents).start = piVar4;
        if (piVar4 != (int *)0x0) {
          (parser->indents).top = piVar4;
          (parser->indents).end = piVar4 + 0x10;
          pyVar5 = (yaml_simple_key_t *)malloc(0x280);
          (parser->simple_keys).start = pyVar5;
          if (pyVar5 != (yaml_simple_key_t *)0x0) {
            (parser->simple_keys).top = pyVar5;
            (parser->simple_keys).end = pyVar5 + 0x10;
            pyVar6 = (yaml_parser_state_t *)malloc(0x40);
            (parser->states).start = pyVar6;
            if (pyVar6 != (yaml_parser_state_t *)0x0) {
              (parser->states).top = pyVar6;
              (parser->states).end = pyVar6 + 0x10;
              pyVar7 = (yaml_mark_t *)malloc(0x180);
              (parser->marks).start = pyVar7;
              if (pyVar7 != (yaml_mark_t *)0x0) {
                (parser->marks).top = pyVar7;
                (parser->marks).end = pyVar7 + 0x10;
                pyVar8 = (yaml_tag_directive_t *)malloc(0x100);
                (parser->tag_directives).start = pyVar8;
                if (pyVar8 != (yaml_tag_directive_t *)0x0) {
                  (parser->tag_directives).top = pyVar8;
                  (parser->tag_directives).end = pyVar8 + 0x10;
                  return 1;
                }
              }
            }
          }
        }
      }
    }
  }
  parser->error = YAML_MEMORY_ERROR;
  puVar1 = (parser->raw_buffer).start;
  if (puVar1 != (uchar *)0x0) {
    free(puVar1);
  }
  (parser->raw_buffer).start = (uchar *)0x0;
  (parser->raw_buffer).end = (uchar *)0x0;
  (parser->raw_buffer).pointer = (uchar *)0x0;
  pyVar2 = (parser->buffer).start;
  if (pyVar2 != (yaml_char_t *)0x0) {
    free(pyVar2);
  }
  (parser->buffer).start = (yaml_char_t *)0x0;
  (parser->buffer).end = (yaml_char_t *)0x0;
  (parser->buffer).pointer = (yaml_char_t *)0x0;
  pyVar3 = (parser->tokens).start;
  if (pyVar3 != (yaml_token_t *)0x0) {
    free(pyVar3);
  }
  (parser->tokens).head = (yaml_token_t *)0x0;
  (parser->tokens).tail = (yaml_token_t *)0x0;
  (parser->tokens).start = (yaml_token_t *)0x0;
  (parser->tokens).end = (yaml_token_t *)0x0;
  piVar4 = (parser->indents).start;
  if (piVar4 != (int *)0x0) {
    free(piVar4);
  }
  (parser->indents).start = (int *)0x0;
  (parser->indents).end = (int *)0x0;
  (parser->indents).top = (int *)0x0;
  pyVar5 = (parser->simple_keys).start;
  if (pyVar5 != (yaml_simple_key_t *)0x0) {
    free(pyVar5);
  }
  (parser->simple_keys).start = (yaml_simple_key_t *)0x0;
  (parser->simple_keys).end = (yaml_simple_key_t *)0x0;
  (parser->simple_keys).top = (yaml_simple_key_t *)0x0;
  pyVar6 = (parser->states).start;
  if (pyVar6 != (yaml_parser_state_t *)0x0) {
    free(pyVar6);
  }
  (parser->states).start = (yaml_parser_state_t *)0x0;
  (parser->states).end = (yaml_parser_state_t *)0x0;
  (parser->states).top = (yaml_parser_state_t *)0x0;
  pyVar7 = (parser->marks).start;
  if (pyVar7 != (yaml_mark_t *)0x0) {
    free(pyVar7);
  }
  (parser->marks).start = (yaml_mark_t *)0x0;
  (parser->marks).end = (yaml_mark_t *)0x0;
  (parser->marks).top = (yaml_mark_t *)0x0;
  pyVar8 = (parser->tag_directives).start;
  if (pyVar8 != (yaml_tag_directive_t *)0x0) {
    free(pyVar8);
  }
  (parser->tag_directives).start = (yaml_tag_directive_t *)0x0;
  (parser->tag_directives).end = (yaml_tag_directive_t *)0x0;
  (parser->tag_directives).top = (yaml_tag_directive_t *)0x0;
  return 0;
}

Assistant:

YAML_DECLARE(int)
yaml_parser_initialize(yaml_parser_t *parser)
{
    assert(parser);     /* Non-NULL parser object expected. */

    memset(parser, 0, sizeof(yaml_parser_t));
    if (!BUFFER_INIT(parser, parser->raw_buffer, INPUT_RAW_BUFFER_SIZE))
        goto error;
    if (!BUFFER_INIT(parser, parser->buffer, INPUT_BUFFER_SIZE))
        goto error;
    if (!QUEUE_INIT(parser, parser->tokens, INITIAL_QUEUE_SIZE, yaml_token_t*))
        goto error;
    if (!STACK_INIT(parser, parser->indents, int*))
        goto error;
    if (!STACK_INIT(parser, parser->simple_keys, yaml_simple_key_t*))
        goto error;
    if (!STACK_INIT(parser, parser->states, yaml_parser_state_t*))
        goto error;
    if (!STACK_INIT(parser, parser->marks, yaml_mark_t*))
        goto error;
    if (!STACK_INIT(parser, parser->tag_directives, yaml_tag_directive_t*))
        goto error;

    return 1;

error:

    BUFFER_DEL(parser, parser->raw_buffer);
    BUFFER_DEL(parser, parser->buffer);
    QUEUE_DEL(parser, parser->tokens);
    STACK_DEL(parser, parser->indents);
    STACK_DEL(parser, parser->simple_keys);
    STACK_DEL(parser, parser->states);
    STACK_DEL(parser, parser->marks);
    STACK_DEL(parser, parser->tag_directives);

    return 0;
}